

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char-test.c++
# Opt level: O1

void __thiscall kj::parse::anon_unknown_0::TestCase376::run(TestCase376 *this)

{
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  Bits64 *pBVar6;
  Sequence_<kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>
  *pSVar7;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *paVar8;
  Input input;
  Maybe<kj::String> result;
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>,_kj::parse::_::ArrayToString>
  parser;
  IteratorInput<char,_const_char_*> local_b8;
  Maybe<kj::String> local_98;
  AddFailureAdapter local_78;
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>,_kj::parse::_::ArrayToString>
  local_60;
  
  pBVar6 = &DAT_00459fc0;
  pSVar7 = (Sequence_<kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>
            *)&local_60;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pSVar7->first).subParser.first.bits[0] = *pBVar6;
    pBVar6 = pBVar6 + 1;
    pSVar7 = &((Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>
                *)&pSVar7->first)->rest;
  }
  local_b8.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_b8.pos = "\'hello\'";
  local_b8.end = "";
  local_b8.best = "\'hello\'";
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&local_98,&local_60,&local_b8);
  paVar1 = &local_98.ptr.field_1;
  paVar8 = (anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)0x0;
  if (local_98.ptr.isSet != false) {
    paVar8 = paVar1;
  }
  if (local_98.ptr.isSet == true) {
    if (((local_98.ptr.field_1.value.content.size_ != 6) ||
        (iVar4 = bcmp((paVar8->value).content.ptr,"hello",5), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[39],char_const(&)[6],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x180,ERROR,
                 "\"failed: expected \" \"(\\\"hello\\\") == (*value)\", \"hello\", *value",
                 (char (*) [39])"failed: expected (\"hello\") == (*value)",(char (*) [6])0x392e18,
                 &paVar8->value);
    }
  }
  else {
    local_78.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
    ;
    local_78.line = 0x182;
    local_78.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[28]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x182,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [28])"Expected \"hello\", got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_78);
  }
  if ((local_b8.pos != local_b8.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x184,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  uVar3 = local_98.ptr.field_1.value.content.size_;
  uVar2 = local_98.ptr.field_1.value.content.ptr;
  if ((local_98.ptr.isSet == true) && (local_98.ptr.field_1.value.content.ptr != (char *)0x0)) {
    local_98.ptr.field_1.value.content.ptr = (char *)0x0;
    local_98.ptr.field_1.value.content.size_ = 0;
    (**(local_98.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
              (local_98.ptr.field_1.value.content.disposer,uVar2,1,uVar3,uVar3,0);
  }
  if (local_b8.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_b8.best < local_b8.pos) {
      local_b8.best = local_b8.pos;
    }
    if (local_b8.best <= (local_b8.parent)->best) {
      local_b8.best = (local_b8.parent)->best;
    }
    (local_b8.parent)->best = local_b8.best;
  }
  local_b8.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_b8.pos = "\'test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\x01\x02\x1cn\'";
  local_b8.end = "";
  local_b8.best = "\'test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\x01\x02\x1cn\'";
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&local_98,&local_60,&local_b8);
  paVar8 = (anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)0x0;
  if (local_98.ptr.isSet != false) {
    paVar8 = paVar1;
  }
  if (local_98.ptr.isSet == true) {
    if (((local_98.ptr.field_1.value.content.size_ != 0x13) ||
        (iVar4 = bcmp((paVar8->value).content.ptr,"test\a\b\f\n\r\t\v\'\"?\x01\x02\x1cn",0x12),
        iVar4 != 0)) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[71],char_const(&)[19],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x18c,ERROR,
                 "\"failed: expected \" \"(\\\"test\\\\a\\\\b\\\\f\\\\n\\\\r\\\\t\\\\v\\\\\'\\\\\\\"\\\\?\\\\x01\\\\2\\\\34\\\\156\\\") == (*value)\", \"test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\\x01\\2\\34\\156\", *value"
                 ,(char (*) [71])
                  "failed: expected (\"test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\\x01\\2\\34\\156\") == (*value)"
                 ,(char (*) [19])"test\a\b\f\n\r\t\v\'\"?\x01\x02\x1cn",&paVar8->value);
    }
  }
  else {
    local_78.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
    ;
    local_78.line = 0x18e;
    local_78.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x18e,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [27])"Expected string, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_78);
  }
  if ((local_b8.pos != local_b8.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,400,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  uVar3 = local_98.ptr.field_1.value.content.size_;
  uVar2 = local_98.ptr.field_1.value.content.ptr;
  if ((local_98.ptr.isSet == true) && (local_98.ptr.field_1.value.content.ptr != (char *)0x0)) {
    local_98.ptr.field_1.value.content.ptr = (char *)0x0;
    local_98.ptr.field_1.value.content.size_ = 0;
    (**(local_98.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
              (local_98.ptr.field_1.value.content.disposer,uVar2,1,uVar3,uVar3,0);
  }
  if (local_b8.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_b8.best < local_b8.pos) {
      local_b8.best = local_b8.pos;
    }
    if (local_b8.best <= (local_b8.parent)->best) {
      local_b8.best = (local_b8.parent)->best;
    }
    (local_b8.parent)->best = local_b8.best;
  }
  local_b8.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_b8.pos = "\'foo\"bar\'";
  local_b8.end = "";
  local_b8.best = "\'foo\"bar\'";
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&local_98,&local_60,&local_b8);
  paVar8 = (anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *)0x0;
  if (local_98.ptr.isSet != false) {
    paVar8 = paVar1;
  }
  if (local_98.ptr.isSet == true) {
    if (((local_98.ptr.field_1.value.content.size_ != 8) ||
        (iVar4 = bcmp((paVar8->value).content.ptr,"foo\"bar",7), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[42],char_const(&)[8],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x198,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\\\\\"bar\\\") == (*value)\", \"foo\\\"bar\", *value"
                 ,(char (*) [42])"failed: expected (\"foo\\\"bar\") == (*value)",
                 (char (*) [8])"foo\"bar",&paVar8->value);
    }
  }
  else {
    local_78.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
    ;
    local_78.line = 0x19a;
    local_78.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x19a,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [27])"Expected string, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_78);
  }
  if ((local_b8.pos != local_b8.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x19c,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  uVar3 = local_98.ptr.field_1.value.content.size_;
  uVar2 = local_98.ptr.field_1.value.content.ptr;
  if ((local_98.ptr.isSet == true) && (local_98.ptr.field_1.value.content.ptr != (char *)0x0)) {
    local_98.ptr.field_1.value.content.ptr = (char *)0x0;
    local_98.ptr.field_1.value.content.size_ = 0;
    (**(local_98.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
              (local_98.ptr.field_1.value.content.disposer,uVar2,1,uVar3,uVar3,0);
  }
  if (local_b8.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_b8.best < local_b8.pos) {
      local_b8.best = local_b8.pos;
    }
    if (local_b8.best <= (local_b8.parent)->best) {
      local_b8.best = (local_b8.parent)->best;
    }
    (local_b8.parent)->best = local_b8.best;
  }
  return;
}

Assistant:

TEST(CharParsers, SingleQuotedString) {
  constexpr auto parser = singleQuotedString;

  {
    StringPtr text = "\'hello\'";
    Input input(text.begin(), text.end());
    Maybe<String> result = parser(input);
    KJ_IF_MAYBE(value, result) {
      EXPECT_EQ("hello", *value);
    } else {
      ADD_FAILURE() << "Expected \"hello\", got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }